

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O3

void after_write(uv_write_t *req,int status)

{
  int iVar1;
  uv_handle_t *handle;
  
  if (status == 0) {
    free(req);
    after_write_cb_called = after_write_cb_called + 1;
    return;
  }
  handle = (uv_handle_t *)(ulong)(uint)status;
  after_write_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void after_write(uv_write_t* req, int status) {
  if (status) {
    fprintf(stderr, "uv_write error: %s\n", uv_strerror(status));
    ASSERT(0);
  }

  /* Free the read/write buffer and the request */
  free(req);

  after_write_cb_called++;
}